

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

void __thiscall
wasm::RandomElement<wasm::RandomFullLattice>::RandomElement
          (RandomElement<wasm::RandomFullLattice> *this,
          RandomElement<wasm::RandomFullLattice> *other)

{
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  local_48;
  anon_class_8_1_a86c6e30 local_20;
  
  local_20.other = other;
  RandomElement::anon_class_8_1_a86c6e30::operator()((ElementImpl *)&local_48,&local_20);
  RandomElement(this,(ElementImpl *)&local_48);
  std::__detail::__variant::
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::~_Variant_storage(&local_48);
  return;
}

Assistant:

RandomElement(const RandomElement& other)
    : RandomElement([&]() {
        auto copy = *other;
        return copy;
      }()) {}